

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetReference<Js::StringProfiler::UintUintPair>
          (BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,UintUintPair *key,ConcatMetrics **value,int *index)

{
  uint uVar1;
  
  uVar1 = FindEntryWithKey<Js::StringProfiler::UintUintPair>(this,key);
  if (-1 < (int)uVar1) {
    *value = (ConcatMetrics *)(this->entries + uVar1);
    *index = uVar1;
  }
  return -1 < (int)uVar1;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }